

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O3

DdNode * Cudd_bddPickOneMinterm(DdManager *dd,DdNode *f,DdNode **vars,int n)

{
  int iVar1;
  char *string;
  char *__ptr;
  ulong uVar2;
  ulong uVar3;
  DdNode *pDVar4;
  ulong uVar5;
  DdNode *f_00;
  
  string = (char *)malloc((long)dd->size);
  if (string == (char *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    __ptr = (char *)malloc((long)n << 2);
    if (__ptr == (char *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      uVar5 = (ulong)(uint)n;
      if (n < 1) {
        iVar1 = Cudd_bddPickOneCube(dd,f,string);
        if (iVar1 != 0) goto LAB_007a2b76;
      }
      else {
        uVar2 = 0;
        do {
          *(DdHalfWord *)(__ptr + uVar2 * 4) = vars[uVar2]->index;
          uVar2 = uVar2 + 1;
        } while (uVar5 != uVar2);
        iVar1 = Cudd_bddPickOneCube(dd,f,string);
        if (iVar1 != 0) {
          if (0 < n) {
            uVar2 = 0;
            do {
              iVar1 = *(int *)(__ptr + uVar2 * 4);
              if (string[iVar1] == '\x02') {
                uVar3 = Cudd_Random();
                string[iVar1] = (byte)(uVar3 >> 5) & 1;
              }
              uVar2 = uVar2 + 1;
            } while (uVar5 != uVar2);
          }
LAB_007a2b76:
          pDVar4 = Cudd_ReadOne(dd);
          uVar2 = (ulong)pDVar4 & 0xfffffffffffffffe;
          *(int *)(uVar2 + 4) = *(int *)(uVar2 + 4) + 1;
          if (0 < n) {
            uVar5 = uVar5 + 1;
            f_00 = pDVar4;
            do {
              pDVar4 = Cudd_bddAnd(dd,f_00,(DdNode *)
                                           ((ulong)(string[*(int *)(__ptr + uVar5 * 4 + -8)] == '\0'
                                                   ) ^ (ulong)vars[uVar5 - 2]));
              if (pDVar4 == (DdNode *)0x0) {
                free(string);
                free(__ptr);
                Cudd_RecursiveDeref(dd,f_00);
                return (DdNode *)0x0;
              }
              uVar2 = (ulong)pDVar4 & 0xfffffffffffffffe;
              *(int *)(uVar2 + 4) = *(int *)(uVar2 + 4) + 1;
              Cudd_RecursiveDeref(dd,f_00);
              uVar5 = uVar5 - 1;
              f_00 = pDVar4;
            } while (1 < uVar5);
          }
          *(int *)(uVar2 + 4) = *(int *)(uVar2 + 4) + -1;
          free(string);
          free(__ptr);
          return pDVar4;
        }
      }
      free(string);
      string = __ptr;
    }
    free(string);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_bddPickOneMinterm(
  DdManager * dd /* manager */,
  DdNode * f /* function from which to pick one minterm */,
  DdNode ** vars /* array of variables */,
  int  n /* size of <code>vars</code> */)
{
    char *string;
    int i, size;
    int *indices;
    int result;
    DdNode *old, *neW;

    size = dd->size;
    string = ABC_ALLOC(char, size);
    if (string == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    indices = ABC_ALLOC(int,n);
    if (indices == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(string);
        return(NULL);
    }

    for (i = 0; i < n; i++) {
        indices[i] = vars[i]->index;
    }

    result = Cudd_bddPickOneCube(dd,f,string);
    if (result == 0) {
        ABC_FREE(string);
        ABC_FREE(indices);
        return(NULL);
    }

    /* Randomize choice for don't cares. */
    for (i = 0; i < n; i++) {
        if (string[indices[i]] == 2)
            string[indices[i]] = (char) ((Cudd_Random() & 0x20) >> 5);
    }

    /* Build result BDD. */
    old = Cudd_ReadOne(dd);
    cuddRef(old);

    for (i = n-1; i >= 0; i--) {
        neW = Cudd_bddAnd(dd,old,Cudd_NotCond(vars[i],string[indices[i]]==0));
        if (neW == NULL) {
            ABC_FREE(string);
            ABC_FREE(indices);
            Cudd_RecursiveDeref(dd,old);
            return(NULL);
        }
        cuddRef(neW);
        Cudd_RecursiveDeref(dd,old);
        old = neW;
    }

#ifdef DD_DEBUG
    /* Test. */
    if (Cudd_bddLeq(dd,old,f)) {
        cuddDeref(old);
    } else {
        Cudd_RecursiveDeref(dd,old);
        old = NULL;
    }
#else
    cuddDeref(old);
#endif

    ABC_FREE(string);
    ABC_FREE(indices);
    return(old);

}